

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O1

RTIMU * RTIMU::createIMU(RTIMUSettings *settings)

{
  int iVar1;
  bool bVar2;
  RTIMUMPU9150 *this;
  RTIMUNull *this_00;
  
  while( true ) {
    iVar1 = *(int *)&(settings->super_RTIMUHal).field_0x1c;
    if (iVar1 != 0) {
      switch(iVar1) {
      case 1:
        this = (RTIMUMPU9150 *)operator_new(0x108);
        RTIMUNull::RTIMUNull((RTIMUNull *)this,settings);
        break;
      case 2:
        this = (RTIMUMPU9150 *)operator_new(0xe38);
        RTIMUMPU9150::RTIMUMPU9150(this,settings);
        break;
      case 3:
        this = (RTIMUMPU9150 *)operator_new(0x110);
        RTIMUGD20HM303D::RTIMUGD20HM303D((RTIMUGD20HM303D *)this,settings);
        break;
      case 4:
        this = (RTIMUMPU9150 *)operator_new(0x118);
        RTIMUGD20M303DLHC::RTIMUGD20M303DLHC((RTIMUGD20M303DLHC *)this,settings);
        break;
      case 5:
        this = (RTIMUMPU9150 *)operator_new(0x110);
        RTIMULSM9DS0::RTIMULSM9DS0((RTIMULSM9DS0 *)this,settings);
        break;
      case 6:
        this = (RTIMUMPU9150 *)operator_new(0x110);
        RTIMULSM9DS1::RTIMULSM9DS1((RTIMULSM9DS1 *)this,settings);
        break;
      case 7:
        this = (RTIMUMPU9150 *)operator_new(0xe30);
        RTIMUMPU9250::RTIMUMPU9250((RTIMUMPU9250 *)this,settings);
        break;
      case 8:
        this = (RTIMUMPU9150 *)operator_new(0x118);
        RTIMUGD20HM303DLHC::RTIMUGD20HM303DLHC((RTIMUGD20HM303DLHC *)this,settings);
        break;
      case 9:
        this = (RTIMUMPU9150 *)operator_new(0x120);
        RTIMUBMX055::RTIMUBMX055((RTIMUBMX055 *)this,settings);
        break;
      case 10:
        this = (RTIMUMPU9150 *)operator_new(0x110);
        RTIMUBNO055::RTIMUBNO055((RTIMUBNO055 *)this,settings);
        break;
      default:
        this = (RTIMUMPU9150 *)0x0;
      }
      return &this->super_RTIMU;
    }
    bVar2 = RTIMUSettings::discoverIMU
                      (settings,(int *)&(settings->super_RTIMUHal).field_0x1c,
                       &(settings->super_RTIMUHal).m_busIsI2C,&settings->m_I2CSlaveAddress);
    if (!bVar2) break;
    (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])(settings);
  }
  this_00 = (RTIMUNull *)operator_new(0x108);
  RTIMUNull::RTIMUNull(this_00,settings);
  return &this_00->super_RTIMU;
}

Assistant:

RTIMU *RTIMU::createIMU(RTIMUSettings *settings)
{
    switch (settings->m_imuType) {
    case RTIMU_TYPE_MPU9150:
        return new RTIMUMPU9150(settings);

    case RTIMU_TYPE_GD20HM303D:
        return new RTIMUGD20HM303D(settings);

    case RTIMU_TYPE_GD20M303DLHC:
        return new RTIMUGD20M303DLHC(settings);

    case RTIMU_TYPE_LSM9DS0:
        return new RTIMULSM9DS0(settings);
    case RTIMU_TYPE_LSM9DS1:
        return new RTIMULSM9DS1(settings);

    case RTIMU_TYPE_MPU9250:
        return new RTIMUMPU9250(settings);

    case RTIMU_TYPE_GD20HM303DLHC:
        return new RTIMUGD20HM303DLHC(settings);

    case RTIMU_TYPE_BMX055:
        return new RTIMUBMX055(settings);

    case RTIMU_TYPE_BNO055:
        return new RTIMUBNO055(settings);

    case RTIMU_TYPE_AUTODISCOVER:
        if (settings->discoverIMU(settings->m_imuType, settings->m_busIsI2C, settings->m_I2CSlaveAddress)) {
            settings->saveSettings();
            return RTIMU::createIMU(settings);
        }
        return new RTIMUNull(settings);

    case RTIMU_TYPE_NULL:
        return new RTIMUNull(settings);

    default:
        return NULL;
    }
}